

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddIte.c
# Opt level: O3

DdNode * cuddBddIteRecur(DdManager *dd,DdNode *f,DdNode *g,DdNode *h)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  uint index;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  DdNode *h_00;
  DdNode *T;
  uint uVar8;
  DdNode *pDVar9;
  DdNode *f_00;
  ulong uVar10;
  DdNode *h_01;
  uint *puVar11;
  
  pDVar5 = dd->one;
  if (pDVar5 == f) {
    return g;
  }
  pDVar9 = (DdNode *)((ulong)pDVar5 ^ 1);
  if (pDVar9 == f) {
    return h;
  }
  if (g == f || pDVar5 == g) {
    if (pDVar9 == h) {
      return f;
    }
    f = (DdNode *)((ulong)f ^ 1);
    pDVar6 = (DdNode *)((ulong)h ^ 1);
  }
  else {
    pDVar6 = (DdNode *)((ulong)g ^ 1);
    if ((pDVar6 == f) || (pDVar9 == g)) {
      f = (DdNode *)((ulong)f ^ 1);
      g = h;
      if (pDVar5 == h) {
        return f;
      }
LAB_007c99fe:
      pDVar5 = cuddBddAndRecur(dd,f,g);
      return pDVar5;
    }
    if ((h == f) || (pDVar9 == h)) goto LAB_007c99fe;
    if ((pDVar5 != h) && ((DdNode *)((ulong)h ^ 1) != f)) {
      if (g == h) {
        return g;
      }
      if ((DdNode *)((ulong)h ^ 1) == g) {
        pDVar5 = cuddBddXorRecur(dd,f,h);
        return pDVar5;
      }
      f_00 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
      pDVar7 = h;
      pDVar6 = f_00;
      if (((ulong)f & 1) == 0) {
        pDVar7 = g;
        pDVar6 = f;
      }
      if (((ulong)pDVar7 & 1) == 0) {
        uVar10 = 0;
        T = h;
        if (((ulong)f & 1) == 0) {
          T = g;
          g = h;
          f_00 = f;
        }
      }
      else {
        if (((ulong)f & 1) == 0) {
          g = h;
        }
        uVar10 = 1;
        T = (DdNode *)((ulong)pDVar7 & 0xfffffffffffffffe);
        g = (DdNode *)((ulong)g ^ 1);
        f_00 = pDVar6;
      }
      piVar4 = dd->perm;
      uVar1 = piVar4[pDVar6->index];
      uVar2 = piVar4[T->index];
      puVar11 = (uint *)((ulong)g & 0xfffffffffffffffe);
      uVar3 = piVar4[*puVar11];
      uVar8 = uVar2;
      if (uVar3 < uVar2) {
        uVar8 = uVar3;
      }
      if (((uVar1 < uVar8) && ((f_00->type).kids.T == pDVar5)) && ((f_00->type).kids.E == pDVar9)) {
        pDVar5 = cuddUniqueInter(dd,f_00->index,T,g);
        uVar10 = (ulong)(pDVar5 != (DdNode *)0x0 & (byte)pDVar7);
      }
      else {
        pDVar5 = cuddCacheLookup(dd,0xe,f_00,T,g);
        if (pDVar5 == (DdNode *)0x0) {
          index = 0xffffffff;
          pDVar9 = f_00;
          pDVar5 = f_00;
          if (uVar1 <= uVar8) {
            index = f_00->index;
            pDVar5 = (f_00->type).kids.T;
            pDVar9 = (f_00->type).kids.E;
            uVar8 = uVar1;
          }
          pDVar7 = T;
          pDVar6 = T;
          if (uVar2 == uVar8) {
            index = T->index;
            pDVar6 = (T->type).kids.T;
            pDVar7 = (T->type).kids.E;
          }
          h_00 = g;
          h_01 = g;
          if (uVar3 == uVar8) {
            index = *puVar11;
            h_00 = *(DdNode **)(puVar11 + 4);
            h_01 = *(DdNode **)(puVar11 + 6);
            if (((ulong)g & 1) != 0) {
              h_00 = (DdNode *)((ulong)h_00 ^ 1);
              h_01 = (DdNode *)((ulong)h_01 ^ 1);
            }
          }
          pDVar5 = cuddBddIteRecur(dd,pDVar5,pDVar6,h_00);
          if (pDVar5 != (DdNode *)0x0) {
            piVar4 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
            *piVar4 = *piVar4 + 1;
            pDVar9 = cuddBddIteRecur(dd,pDVar9,pDVar7,h_01);
            if (pDVar9 != (DdNode *)0x0) {
              piVar4 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
              *piVar4 = *piVar4 + 1;
              pDVar6 = pDVar5;
              if ((pDVar5 == pDVar9) ||
                 (pDVar6 = cuddUniqueInter(dd,index,pDVar5,pDVar9), pDVar6 != (DdNode *)0x0)) {
                piVar4 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
                *piVar4 = *piVar4 + -1;
                piVar4 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
                *piVar4 = *piVar4 + -1;
                cuddCacheInsert(dd,0xe,f_00,T,g,pDVar6);
                return (DdNode *)(uVar10 ^ (ulong)pDVar6);
              }
              Cudd_IterDerefBdd(dd,pDVar5);
              pDVar5 = pDVar9;
            }
            Cudd_IterDerefBdd(dd,pDVar5);
          }
          return (DdNode *)0x0;
        }
      }
      goto LAB_007c991d;
    }
  }
  pDVar5 = cuddBddAndRecur(dd,f,pDVar6);
  uVar10 = (ulong)(pDVar5 != (DdNode *)0x0);
LAB_007c991d:
  return (DdNode *)(uVar10 ^ (ulong)pDVar5);
}

Assistant:

DdNode *
cuddBddIteRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * h)
{
    DdNode       *one, *zero, *res;
    DdNode       *r, *Fv, *Fnv, *Gv, *Gnv, *H, *Hv, *Hnv, *t, *e;
    unsigned int topf, topg, toph, v;
    int          index = -1;
    int          comple;

    statLine(dd);
    /* Terminal cases. */

    /* One variable cases. */
    if (f == (one = DD_ONE(dd)))        /* ITE(1,G,H) = G */
        return(g);
    
    if (f == (zero = Cudd_Not(one)))    /* ITE(0,G,H) = H */
        return(h);
    
    /* From now on, f is known not to be a constant. */
    if (g == one || f == g) {   /* ITE(F,F,H) = ITE(F,1,H) = F + H */
        if (h == zero) {        /* ITE(F,1,0) = F */
            return(f);
        } else {
            res = cuddBddAndRecur(dd,Cudd_Not(f),Cudd_Not(h));
            return(Cudd_NotCond(res,res != NULL));
        }
    } else if (g == zero || f == Cudd_Not(g)) { /* ITE(F,!F,H) = ITE(F,0,H) = !F * H */
        if (h == one) {         /* ITE(F,0,1) = !F */
            return(Cudd_Not(f));
        } else {
            res = cuddBddAndRecur(dd,Cudd_Not(f),h);
            return(res);
        }
    }
    if (h == zero || f == h) {    /* ITE(F,G,F) = ITE(F,G,0) = F * G */
        res = cuddBddAndRecur(dd,f,g);
        return(res);
    } else if (h == one || f == Cudd_Not(h)) { /* ITE(F,G,!F) = ITE(F,G,1) = !F + G */
        res = cuddBddAndRecur(dd,f,Cudd_Not(g));
        return(Cudd_NotCond(res,res != NULL));
    }

    /* Check remaining one variable case. */
    if (g == h) {               /* ITE(F,G,G) = G */
        return(g);
    } else if (g == Cudd_Not(h)) { /* ITE(F,G,!G) = F <-> G */
        res = cuddBddXorRecur(dd,f,h);
        return(res);
    }
    
    /* From here, there are no constants. */
    comple = bddVarToCanonicalSimple(dd, &f, &g, &h, &topf, &topg, &toph);

    /* f & g are now regular pointers */

    v = ddMin(topg, toph);

    /* A shortcut: ITE(F,G,H) = (v,G,H) if F = (v,1,0), v < top(G,H). */
    if (topf < v && cuddT(f) == one && cuddE(f) == zero) {
        r = cuddUniqueInter(dd, (int) f->index, g, h);
        return(Cudd_NotCond(r,comple && r != NULL));
    }

    /* Check cache. */
    r = cuddCacheLookup(dd, DD_BDD_ITE_TAG, f, g, h);
    if (r != NULL) {
        return(Cudd_NotCond(r,comple));
    }

    /* Compute cofactors. */
    if (topf <= v) {
        v = ddMin(topf, v);     /* v = top_var(F,G,H) */
        index = f->index;
        Fv = cuddT(f); Fnv = cuddE(f);
    } else {
        Fv = Fnv = f;
    }
    if (topg == v) {
        index = g->index;
        Gv = cuddT(g); Gnv = cuddE(g);
    } else {
        Gv = Gnv = g;
    }
    if (toph == v) {
        H = Cudd_Regular(h);
        index = H->index;
        Hv = cuddT(H); Hnv = cuddE(H);
        if (Cudd_IsComplement(h)) {
            Hv = Cudd_Not(Hv);
            Hnv = Cudd_Not(Hnv);
        }
    } else {
        Hv = Hnv = h;
    }

    /* Recursive step. */
    t = cuddBddIteRecur(dd,Fv,Gv,Hv);
    if (t == NULL) return(NULL);
    cuddRef(t);

    e = cuddBddIteRecur(dd,Fnv,Gnv,Hnv);
    if (e == NULL) {
        Cudd_IterDerefBdd(dd,t);
        return(NULL);
    }
    cuddRef(e);

    r = (t == e) ? t : cuddUniqueInter(dd,index,t,e);
    if (r == NULL) {
        Cudd_IterDerefBdd(dd,t);
        Cudd_IterDerefBdd(dd,e);
        return(NULL);
    }
    cuddDeref(t);
    cuddDeref(e);

    cuddCacheInsert(dd, DD_BDD_ITE_TAG, f, g, h, r);
    return(Cudd_NotCond(r,comple));

}